

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_elements_transaction_AddSignConfidentialTx2_Test::
cfdcapi_elements_transaction_AddSignConfidentialTx2_Test
          (cfdcapi_elements_transaction_AddSignConfidentialTx2_Test *this)

{
  Test *in_RDI;
  
  testing::Test::Test(in_RDI);
  in_RDI->_vptr_Test =
       (_func_int **)&PTR__cfdcapi_elements_transaction_AddSignConfidentialTx2_Test_009f2d70;
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, AddSignConfidentialTx2) {
  static const char* const kTxData = "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000";

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  int64_t satoshi = 13000000000000;
  char* sighash = nullptr;
  char* tx_string = nullptr;
  ret = CfdCreateConfidentialSighash(
      handle, kTxData, "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", 0,
      kCfdP2wpkh, "03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6", nullptr,
      satoshi, nullptr, kCfdSigHashAll, false, &sighash);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("c90939ef311f105806b401bcfa494921b8df297195fc125ebbd91a018c4066b9", sighash);

    // calc
    char* signature = nullptr;
    static const char* privkey = "cU4KjNUT7GjHm7CkjRjG46SzLrXHXoH3ekXmqa2jTCFPMkQ64sw1";
    ret = CfdCalculateEcSignature(
      handle, sighash, nullptr, privkey, kCfdNetworkRegtest, true, &signature);
    EXPECT_EQ(kCfdSuccess, ret);

    if (ret == kCfdSuccess) {
      EXPECT_STREQ("0268633a57723c6612ef217c49bdf804c632a14be2967c76afec4fd5781ad4c2131f358b2381a039c8c502959c64fbfeccf287be7dae710b4446968553aefbea", signature);
      ret = CfdAddPubkeyHashSign(
        handle, kCfdNetworkElementsRegtest, kTxData,
        "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", 0, kCfdP2wpkh,
        "03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6", signature,
        true, kCfdSigHashAll, false, &tx_string);
      EXPECT_EQ(kCfdSuccess, ret);
      CfdFreeStringBuffer(signature);
    }

    if (ret == kCfdSuccess) {
      EXPECT_STREQ("0200000001020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac0000000000000247304402200268633a57723c6612ef217c49bdf804c632a14be2967c76afec4fd5781ad4c20220131f358b2381a039c8c502959c64fbfeccf287be7dae710b4446968553aefbea012103f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d600000000000000000000000000", tx_string);

      uint32_t count = 0;
      ret = CfdGetConfidentialTxInWitnessCount(handle, tx_string, 0, &count);
      EXPECT_EQ(kCfdSuccess, ret);
      EXPECT_EQ(2, count);

      char* stack = nullptr;
      ret = CfdGetConfidentialTxInWitness(handle, tx_string, 0, 1, &stack);
      EXPECT_EQ(kCfdSuccess, ret);
      EXPECT_STREQ("03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6", stack);
      if (ret == kCfdSuccess) {
        CfdFreeStringBuffer(stack);
      }
    }

    CfdFreeStringBuffer(sighash);
  }

  CfdFreeStringBuffer(tx_string);

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}